

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Medals.cpp
# Opt level: O0

void __thiscall
RenX_MedalsPlugin::RenX_OnJoin(RenX_MedalsPlugin *this,Server *server,PlayerInfo *player)

{
  PlayerInfo *pPVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  Config *pCVar5;
  ValuesHashTable *this_00;
  undefined1 auVar6 [16];
  __sv_type _Var7;
  size_t local_120;
  char *local_118;
  allocator<char> local_109;
  string local_108 [8];
  string tagged_msg;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  string local_c8;
  __sv_type local_a8;
  undefined1 local_98 [8];
  string_view msg;
  size_t table_size;
  char *local_78;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  undefined1 local_60 [16];
  string_view local_50;
  __sv_type local_40;
  Config *local_30;
  Config *section;
  PlayerInfo *pPStack_20;
  int worth;
  PlayerInfo *player_local;
  Server *server_local;
  RenX_MedalsPlugin *this_local;
  
  pPStack_20 = player;
  player_local = (PlayerInfo *)server;
  server_local = (Server *)this;
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&player->uuid);
  if (((!bVar2) && ((pPStack_20->isBot & 1U) == 0)) &&
     (uVar4 = RenX::Server::isMatchInProgress(), (uVar4 & 1) != 0)) {
    section._4_4_ = getWorth(pPStack_20);
    local_40 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)&this->firstSection);
    pCVar5 = (Config *)
             Jupiter::Config::getSection(&this->field_0x38,local_40._M_len,local_40._M_str);
    while (pCVar5 != (Config *)0x0) {
      local_30 = pCVar5;
      local_50 = sv("MaxRecs",7);
      iVar3 = std::numeric_limits<int>::max();
      iVar3 = Jupiter::Config::get<int>(pCVar5,local_50,iVar3);
      pCVar5 = local_30;
      if (section._4_4_ <= iVar3) {
        this_00 = Jupiter::Config::getTable_abi_cxx11_(local_30);
        msg._M_str = (char *)std::
                             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::size(this_00);
        pCVar5 = local_30;
        if (msg._M_str == (char *)0x0) {
          return;
        }
        iVar3 = rand();
        string_printf_abi_cxx11_(&local_c8,"%u",(ulong)(long)iVar3 % (ulong)msg._M_str + 1);
        local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c8);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8);
        auVar6 = Jupiter::Config::get
                           (pCVar5,local_a8._M_len,local_a8._M_str,local_d8._M_len,local_d8._M_str);
        msg._M_len = auVar6._8_8_;
        local_98 = auVar6._0_8_;
        std::__cxx11::string::~string((string *)&local_c8);
        bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_98);
        if (bVar2) {
          return;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (local_108,(basic_string_view<char,_std::char_traits<char>_> *)local_98,&local_109
                  );
        std::allocator<char>::~allocator(&local_109);
        RenX::sanitizeTags(local_108);
        RenX::processTags(local_108,(Server *)player_local,pPStack_20,(PlayerInfo *)0x0,
                          (BuildingInfo *)0x0);
        pPVar1 = player_local;
        _Var7 = std::__cxx11::string::operator_cast_to_basic_string_view(local_108);
        local_120 = _Var7._M_len;
        local_118 = _Var7._M_str;
        RenX::Server::sendMessage(pPVar1,local_120,local_118);
        std::__cxx11::string::~string(local_108);
        return;
      }
      local_70 = sv("NextSection",0xb);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&table_size);
      auVar6 = Jupiter::Config::get(pCVar5,local_70._M_len,local_70._M_str,table_size,local_78);
      local_60 = auVar6;
      pCVar5 = (Config *)Jupiter::Config::getSection(&this->field_0x38,auVar6._0_8_,auVar6._8_8_);
    }
  }
  return;
}

Assistant:

void RenX_MedalsPlugin::RenX_OnJoin(RenX::Server &server, const RenX::PlayerInfo &player) {
	if (!player.uuid.empty() && player.isBot == false && server.isMatchInProgress()) {
		int worth = getWorth(player);
		Jupiter::Config *section = RenX_MedalsPlugin::config.getSection(RenX_MedalsPlugin::firstSection);
		if (section != nullptr) {
			while (section->get<int>("MaxRecs"sv, std::numeric_limits<int>::max()) < worth) {
				if ((section = RenX_MedalsPlugin::config.getSection(section->get("NextSection"sv))) == nullptr) {
					return; // No matching section found.
				}
			}

			size_t table_size = section->getTable().size();

			if (table_size != 0) {
				std::string_view msg = section->get(string_printf("%u", (rand() % table_size) + 1));

				if (!msg.empty()) {
					std::string tagged_msg = static_cast<std::string>(msg);
					RenX::sanitizeTags(tagged_msg);
					RenX::processTags(tagged_msg, &server, &player);
					server.sendMessage(tagged_msg);
				}
			}
		}
	}
}